

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O2

void ecdh_exchange_state_cleanup(LIBSSH2_SESSION *session,kmdhgGPshakex_state_t *exchange_state)

{
  BN_clear_free((BIGNUM *)exchange_state->k);
  exchange_state->k = (BIGNUM *)0x0;
  if (exchange_state->k_value != (uchar *)0x0) {
    (*session->free)(exchange_state->k_value,&session->abstract);
    exchange_state->k_value = (uchar *)0x0;
  }
  exchange_state->state = libssh2_NB_state_idle;
  return;
}

Assistant:

static void
ecdh_exchange_state_cleanup(LIBSSH2_SESSION * session,
                            kmdhgGPshakex_state_t *exchange_state)
{
    _libssh2_bn_free(exchange_state->k);
    exchange_state->k = NULL;

    if(exchange_state->k_value) {
        LIBSSH2_FREE(session, exchange_state->k_value);
        exchange_state->k_value = NULL;
    }

    exchange_state->state = libssh2_NB_state_idle;
}